

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

int __thiscall flatbuffers::FlatCompiler::Compile(FlatCompiler *this,FlatCOptions *options)

{
  bool bVar1;
  SizeT SVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  flatbuffers *this_00;
  __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01
  ;
  element_type *peVar6;
  type pPVar7;
  string *in_RCX;
  shared_ptr<flatbuffers::CodeGenerator> *code_generator;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
  *__range1;
  unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> parser;
  string local_1320;
  undefined4 local_12fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f8;
  undefined1 local_12d8 [8];
  Parser parser_1;
  IDLOptions binary_opts;
  uint64_t binary_schema_size;
  uint8_t *binary_schema;
  undefined1 local_818 [8];
  string schema_contents;
  undefined1 local_7f0 [7];
  bool is_binary_schema;
  undefined1 local_7c0 [8];
  string ext;
  Parser conform_parser;
  FlatCOptions *options_local;
  FlatCompiler *this_local;
  
  GetConformParser((Parser *)((long)&ext.field_2 + 8),this,options);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    GetExtension((string *)local_7c0,&options->annotate_schema);
    pcVar5 = reflection::SchemaExtension();
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_7c0,pcVar5);
    if ((!bVar1) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_7c0,"fbs"), !bVar1)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7f0,
                     "Expected a `.bfbs` or `.fbs` schema, got: ",&options->annotate_schema);
      in_RCX = (string *)0x1;
      Error(this,(string *)local_7f0,true,true);
      std::__cxx11::string::~string((string *)local_7f0);
    }
    pcVar5 = reflection::SchemaExtension();
    schema_contents.field_2._M_local_buf[0xf] =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7c0,pcVar5);
    std::__cxx11::string::string((string *)local_818);
    this_00 = (flatbuffers *)std::__cxx11::string::c_str();
    bVar1 = LoadFile(this_00,(char *)(ulong)((byte)schema_contents.field_2._M_local_buf[0xf] & 1),
                     SUB81((string *)local_818,0),in_RCX);
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &binary_schema,"unable to load schema: ",&options->annotate_schema);
      Error(this,(string *)&binary_schema,true,true);
      std::__cxx11::string::~string((string *)&binary_schema);
    }
    IDLOptions::IDLOptions((IDLOptions *)&parser_1.anonymous_counter_);
    Parser::Parser((Parser *)local_12d8,(IDLOptions *)&parser_1.anonymous_counter_);
    if ((schema_contents.field_2._M_local_buf[0xf] & 1U) == 0) {
      ParseFile(this,(Parser *)local_12d8,&options->annotate_schema,(string *)local_818,
                &options->include_directories);
      Parser::Serialize((Parser *)local_12d8);
      binary_schema_size =
           (uint64_t)
           FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)((long)&parser_1.error_.field_2 + 8));
      SVar2 = FlatBufferBuilderImpl<false>::GetSize
                        ((FlatBufferBuilderImpl<false> *)((long)&parser_1.error_.field_2 + 8));
      binary_opts._776_8_ = ZEXT48(SVar2);
    }
    else {
      binary_schema_size = std::__cxx11::string::c_str();
      binary_opts._776_8_ = std::__cxx11::string::size();
    }
    if ((binary_schema_size == 0) || (binary_opts._776_8_ == 0)) {
      std::operator+(&local_12f8,"could not parse a value binary schema from: ",
                     &options->annotate_schema);
      Error(this,&local_12f8,true,true);
      std::__cxx11::string::~string((string *)&local_12f8);
    }
    AnnotateBinaries(this,(uint8_t *)binary_schema_size,binary_opts._776_8_,options);
    this_local._4_4_ = 0;
    local_12fc = 1;
    Parser::~Parser((Parser *)local_12d8);
    IDLOptions::~IDLOptions((IDLOptions *)&parser_1.anonymous_counter_);
    std::__cxx11::string::~string((string *)local_818);
    std::__cxx11::string::~string((string *)local_7c0);
  }
  else {
    bVar1 = std::
            vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
            ::empty(&options->generators);
    if ((bVar1) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1320,"No generator registered",
                 (allocator<char> *)
                 ((long)&parser._M_t.
                         super___uniq_ptr_impl<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flatbuffers::Parser_*,_std::default_delete<flatbuffers::Parser>_>
                         .super__Head_base<0UL,_flatbuffers::Parser_*,_false>._M_head_impl + 7));
      Error(this,&local_1320,true,true);
      std::__cxx11::string::~string((string *)&local_1320);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&parser._M_t.
                         super___uniq_ptr_impl<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flatbuffers::Parser_*,_std::default_delete<flatbuffers::Parser>_>
                         .super__Head_base<0UL,_flatbuffers::Parser_*,_false>._M_head_impl + 7));
      this_local._4_4_ = -1;
      local_12fc = 1;
    }
    else {
      GenerateCode((FlatCompiler *)&__range1,(FlatCOptions *)this,(Parser *)options);
      __end1 = std::
               vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
               ::begin(&options->generators);
      code_generator =
           (shared_ptr<flatbuffers::CodeGenerator> *)
           std::
           vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
           ::end(&options->generators);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_std::shared_ptr<flatbuffers::CodeGenerator>_*,_std::vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                                         *)&code_generator), bVar1) {
        this_01 = (__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<const_std::shared_ptr<flatbuffers::CodeGenerator>_*,_std::vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                     ::operator*(&__end1);
        peVar6 = std::
                 __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_01);
        uVar3 = (*peVar6->_vptr_CodeGenerator[10])();
        if ((uVar3 & 1) != 0) {
          peVar6 = std::
                   __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(this_01);
          pPVar7 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                   operator*((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                              *)&__range1);
          (*peVar6->_vptr_CodeGenerator[7])(peVar6,pPVar7,&options->output_path);
        }
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<flatbuffers::CodeGenerator>_*,_std::vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
        ::operator++(&__end1);
      }
      this_local._4_4_ = 0;
      local_12fc = 1;
      std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::~unique_ptr
                ((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> *)
                 &__range1);
    }
  }
  Parser::~Parser((Parser *)((long)&ext.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

int FlatCompiler::Compile(const FlatCOptions &options) {
  // TODO(derekbailey): change to std::optional<Parser>
  Parser conform_parser = GetConformParser(options);

  // TODO(derekbailey): split to own method.
  if (!options.annotate_schema.empty()) {
    const std::string ext = flatbuffers::GetExtension(options.annotate_schema);
    if (!(ext == reflection::SchemaExtension() || ext == "fbs")) {
      Error("Expected a `.bfbs` or `.fbs` schema, got: " +
            options.annotate_schema);
    }

    const bool is_binary_schema = ext == reflection::SchemaExtension();

    std::string schema_contents;
    if (!flatbuffers::LoadFile(options.annotate_schema.c_str(),
                               /*binary=*/is_binary_schema, &schema_contents)) {
      Error("unable to load schema: " + options.annotate_schema);
    }

    const uint8_t *binary_schema = nullptr;
    uint64_t binary_schema_size = 0;

    IDLOptions binary_opts;
    binary_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
    Parser parser(binary_opts);

    if (is_binary_schema) {
      binary_schema =
          reinterpret_cast<const uint8_t *>(schema_contents.c_str());
      binary_schema_size = schema_contents.size();
    } else {
      // If we need to generate the .bfbs file from the provided schema file
      // (.fbs)
      ParseFile(parser, options.annotate_schema, schema_contents,
                options.include_directories);
      parser.Serialize();

      binary_schema = parser.builder_.GetBufferPointer();
      binary_schema_size = parser.builder_.GetSize();
    }

    if (binary_schema == nullptr || !binary_schema_size) {
      Error("could not parse a value binary schema from: " +
            options.annotate_schema);
    }

    // Annotate the provided files with the binary_schema.
    AnnotateBinaries(binary_schema, binary_schema_size, options);

    // We don't support doing anything else after annotating a binary.
    return 0;
  }

  if (options.generators.empty() && options.conform_to_schema.empty()) {
    Error("No generator registered");
    return -1;
  }

  std::unique_ptr<Parser> parser = GenerateCode(options, conform_parser);

  for (const auto &code_generator : options.generators) {
    if (code_generator->SupportsRootFileGeneration()) {
      code_generator->GenerateRootFile(*parser, options.output_path);
    }
  }

  return 0;
}